

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_25095d::ParameterPackExpansion::printLeft
          (ParameterPackExpansion *this,OutputStream *S)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  uint I;
  uint uVar5;
  StringView R;
  StringView R_00;
  
  uVar3 = S->CurrentPackIndex;
  uVar4 = S->CurrentPackMax;
  S->CurrentPackIndex = 0xffffffff;
  S->CurrentPackMax = 0xffffffff;
  sVar2 = S->CurrentPosition;
  Node::print(this->Child,S);
  uVar1 = S->CurrentPackMax;
  if (uVar1 == 0xffffffff) {
    R.Last = "";
    R.First = "...";
    OutputStream::operator+=(S,R);
  }
  else if (uVar1 == 0) {
    S->CurrentPosition = sVar2;
  }
  else {
    for (uVar5 = 1; uVar5 < uVar1; uVar5 = uVar5 + 1) {
      R_00.Last = "";
      R_00.First = ", ";
      OutputStream::operator+=(S,R_00);
      S->CurrentPackIndex = uVar5;
      Node::print(this->Child,S);
    }
  }
  S->CurrentPackIndex = uVar3;
  S->CurrentPackMax = uVar4;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    constexpr unsigned Max = std::numeric_limits<unsigned>::max();
    SwapAndRestore<unsigned> SavePackIdx(S.CurrentPackIndex, Max);
    SwapAndRestore<unsigned> SavePackMax(S.CurrentPackMax, Max);
    size_t StreamPos = S.getCurrentPosition();

    // Print the first element in the pack. If Child contains a ParameterPack,
    // it will set up S.CurrentPackMax and print the first element.
    Child->print(S);

    // No ParameterPack was found in Child. This can occur if we've found a pack
    // expansion on a <function-param>.
    if (S.CurrentPackMax == Max) {
      S += "...";
      return;
    }

    // We found a ParameterPack, but it has no elements. Erase whatever we may
    // of printed.
    if (S.CurrentPackMax == 0) {
      S.setCurrentPosition(StreamPos);
      return;
    }

    // Else, iterate through the rest of the elements in the pack.
    for (unsigned I = 1, E = S.CurrentPackMax; I < E; ++I) {
      S += ", ";
      S.CurrentPackIndex = I;
      Child->print(S);
    }
  }